

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::FboHelper
          (FboHelper *this,RenderContext *renderCtx,int width,int height,deUint32 format,
          int numSamples)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  ObjectTraits *pOVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar4;
  TestError *this_00;
  NotSupportedError *this_01;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  int v;
  string local_50;
  undefined4 extraout_var_03;
  
  this->m_renderCtx = renderCtx;
  this->m_numSamples = width;
  *(undefined8 *)(this->m_size).m_data = 0x10000000100;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])
                    (renderCtx,renderCtx,CONCAT44(in_register_00000014,width),
                     CONCAT44(in_register_0000000c,height),CONCAT44(in_register_00000084,format));
  pOVar3 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_colorbuffer).super_ObjectWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             pOVar3);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar3 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_framebuffer).super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar1)
             ,pOVar3);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar3 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_resolveColorbuffer).super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar1),pOVar3);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar3 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_resolveFramebuffer).super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar1),pOVar3);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var_03,iVar1);
  local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
  (**(code **)(lVar4 + 0x868))(0x8d57);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x96);
  iVar1 = (int)local_50._M_dataplus._M_p;
  (**(code **)(lVar4 + 0xa0))(0x8d41,(this->m_colorbuffer).super_ObjectWrapper.m_object);
  (**(code **)(lVar4 + 0x1240))(0x8d41,this->m_numSamples,0x8058,0x100,0x100);
  (**(code **)(lVar4 + 0x78))(0x8d40,(this->m_framebuffer).super_ObjectWrapper.m_object);
  (**(code **)(lVar4 + 0x688))
            (0x8d40,0x8ce0,0x8d41,(this->m_colorbuffer).super_ObjectWrapper.m_object);
  if (iVar1 < this->m_numSamples) {
    iVar1 = (**(code **)(lVar4 + 0x170))(0x8d40);
    if (iVar1 != 0x8cd5) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Sample count exceeds GL_MAX_SAMPLES","");
      tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar1 = (**(code **)(lVar4 + 0x170))(0x8d40);
  if (iVar1 == 0x8cd5) {
    if (this->m_numSamples != 0) {
      (**(code **)(lVar4 + 0xa0))(0x8d41,(this->m_resolveColorbuffer).super_ObjectWrapper.m_object);
      (**(code **)(lVar4 + 0x1238))(0x8d41,0x8058,0x100,0x100);
      (**(code **)(lVar4 + 0x78))(0x8d40,(this->m_resolveFramebuffer).super_ObjectWrapper.m_object);
      (**(code **)(lVar4 + 0x688))
                (0x8d40,0x8ce0,0x8d41,(this->m_resolveColorbuffer).super_ObjectWrapper.m_object);
      iVar1 = (**(code **)(lVar4 + 0x170))(0x8d40);
      if (iVar1 != 0x8cd5) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                   ,0xf8);
        goto LAB_0060b957;
      }
    }
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Failed to create framebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0xfb);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0xf0);
LAB_0060b957:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FboHelper::FboHelper (const glu::RenderContext& renderCtx, int width, int height, deUint32 format, int numSamples)
	: m_renderCtx			(renderCtx)
	, m_numSamples			(numSamples)
	, m_size				(width, height)
	, m_colorbuffer			(renderCtx)
	, m_framebuffer			(renderCtx)
	, m_resolveColorbuffer	(renderCtx)
	, m_resolveFramebuffer	(renderCtx)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const int				maxSamples	= getInteger(gl, GL_MAX_SAMPLES);

	gl.bindRenderbuffer(GL_RENDERBUFFER, *m_colorbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, format, width, height);
	gl.bindFramebuffer(GL_FRAMEBUFFER, *m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_colorbuffer);

	if (m_numSamples > maxSamples && gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Sample count exceeds GL_MAX_SAMPLES");

	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	if (m_numSamples != 0)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, *m_resolveColorbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
		gl.bindFramebuffer(GL_FRAMEBUFFER, *m_resolveFramebuffer);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_resolveColorbuffer);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create framebuffer");
}